

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_font_atlas_bake(nk_font_atlas *atlas,int *width,int *height,nk_font_atlas_format fmt)

{
  float *scanline;
  nk_vec2 *pnVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  nk_tt__point nVar4;
  nk_tt__point nVar5;
  undefined4 uVar6;
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  nk_byte *data;
  nk_rune *pnVar12;
  uchar *puVar13;
  undefined4 uVar16;
  undefined8 *puVar14;
  nk_baked_font *pnVar15;
  undefined1 auVar17 [16];
  short sVar18;
  short sVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  nk_handle nVar25;
  nk_vec2 nVar26;
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkuint10 Var29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  unkbyte10 Var33;
  undefined1 auVar34 [13];
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  uint6 uVar43;
  nk_rune nVar44;
  nk_rune nVar45;
  int iVar46;
  nk_uint nVar47;
  nk_uint nVar48;
  nk_uint nVar49;
  nk_uint nVar50;
  nk_uint nVar51;
  nk_uint nVar52;
  nk_uint nVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  nk_rune nVar57;
  nk_tt__active_edge *z;
  nk_font *pnVar58;
  void *pvVar59;
  nk_font_glyph *pnVar60;
  uint *puVar61;
  nk_tt_fontinfo *pnVar62;
  nk_tt__point *points;
  long lVar63;
  nk_tt__edge *pnVar64;
  nk_tt__edge *pnVar65;
  undefined8 *puVar66;
  nk_size nVar67;
  long *plVar68;
  ushort uVar69;
  nk_font_config *pnVar70;
  float *pfVar71;
  nk_font_config *pnVar72;
  nk_tt__active_edge *pnVar73;
  nk_tt__active_edge *pnVar74;
  float *pfVar75;
  nk_vec2 *pnVar76;
  nk_handle *pnVar77;
  void *pvVar78;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *tag_06;
  long lVar79;
  ulong uVar80;
  nk_size extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong uVar81;
  ulong extraout_RDX_05;
  nk_size size;
  nk_size size_00;
  ulong uVar82;
  long lVar83;
  nk_uint encoding_record;
  int iVar84;
  uint uVar85;
  int iVar86;
  undefined1 uVar87;
  ulong uVar88;
  nk_tt__edge *pnVar89;
  int iVar90;
  byte *pbVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  uint uVar96;
  nk_handle *alloc;
  short *psVar97;
  long lVar98;
  byte *pbVar99;
  int iVar100;
  bool bVar101;
  byte bVar102;
  char cVar113;
  char cVar114;
  float sum;
  nk_recti nVar106;
  float fVar103;
  char cVar115;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar104;
  float fVar105;
  undefined1 auVar110 [16];
  float fVar116;
  short sVar119;
  ushort uVar120;
  ushort uVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  ushort uVar122;
  ushort uVar126;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar127;
  float fVar128;
  undefined1 in_XMM3 [16];
  undefined1 auVar129 [16];
  float fVar131;
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  float ya;
  long local_458;
  int x1;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  int local_3c4;
  nk_font_glyph *local_3c0;
  undefined8 local_3b8;
  nk_handle *local_3b0;
  nk_font_config *local_3a8;
  nk_tt_fontinfo *local_3a0;
  nk_tt__point *local_398;
  ulong local_390;
  long local_388;
  long local_380;
  nk_font_atlas_format local_378;
  uint local_374;
  uint local_370;
  int local_36c;
  int y0_1;
  int x0_1;
  int iy0;
  int ix0;
  int y0;
  nk_handle nStack_350;
  nk_handle local_348;
  undefined8 *local_340;
  nk_tt__active_edge *local_338;
  int local_330;
  undefined1 local_328 [16];
  long local_318;
  void *local_310;
  long local_308;
  nk_tt__edge *local_300;
  long local_2f8;
  long local_2f0;
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  long local_2d8;
  nk_font_config *local_2d0;
  long local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  nk_size local_2b0;
  nk_size local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined4 *local_288;
  long local_280;
  ulong local_278;
  int local_270;
  int x1_1;
  nk_handle local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  int x0;
  nk_rp_coord nStack_234;
  nk_rp_coord nStack_232;
  uint uStack_230;
  ushort uVar136;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar107 [16];
  
  local_378 = fmt;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b1f,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b20,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b21,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b22,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b23,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b25,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b26,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar84 = atlas->font_num;
  if (iVar84 == 0) {
    pnVar58 = nk_font_atlas_add_default(atlas,13.0,(nk_font_config *)0x0);
    atlas->default_font = pnVar58;
    iVar84 = atlas->font_num;
    if (iVar84 == 0) {
      __assert_fail("atlas->font_num",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2b31,
                    "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                   );
    }
  }
  pnVar72 = atlas->config;
  if (pnVar72 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2716,
                  "void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)");
  }
  atlas->glyph_count = 0;
  if (pnVar72->range == (nk_rune *)0x0) {
    pnVar72->range = nk_font_default_glyph_ranges::ranges;
  }
  iVar46 = 0;
  iVar100 = 0;
  for (; pnVar72 != (nk_font_config *)0x0; pnVar72 = pnVar72->next) {
    iVar46 = nk_range_count(pnVar72->range);
    iVar100 = iVar100 + iVar46;
    iVar46 = nk_range_glyph_count(pnVar72->range,iVar46);
    iVar46 = iVar46 + atlas->glyph_count;
    atlas->glyph_count = iVar46;
  }
  pvVar59 = (*(atlas->temporary).alloc)
                      ((atlas->temporary).userdata,(void *)0x0,
                       (long)iVar100 * 0x28 + (long)iVar46 * 0x2c + (long)iVar84 * 0x48 + 0x88);
  if (pvVar59 == (void *)0x0) {
    __assert_fail("tmp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b37,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar84 = atlas->glyph_count;
  iVar46 = atlas->font_num;
  alloc = (nk_handle *)((long)pvVar59 + 7U & 0xfffffffffffffff8);
  pnVar77 = alloc + 0xd;
  alloc[9].ptr = pnVar77;
  alloc[10].ptr = pnVar77 + (long)iVar46 * 9;
  pvVar78 = (void *)((long)iVar84 * 0x1c + (long)(pnVar77 + (long)iVar46 * 9));
  alloc[0xb].ptr = pvVar78;
  alloc[0xc].ptr = (void *)((long)pvVar78 + (long)iVar84 * 0x10 + 7 & 0xfffffffffffffff8);
  nVar25 = (nk_handle)(atlas->temporary).alloc;
  *alloc = (atlas->temporary).userdata;
  alloc[1] = nVar25;
  alloc[2] = (nk_handle)(atlas->temporary).free;
  pnVar60 = (nk_font_glyph *)
            (*(atlas->permanent).alloc)
                      ((atlas->permanent).userdata,(void *)0x0,(long)atlas->glyph_count * 0x30);
  atlas->glyphs = pnVar60;
  if (pnVar60 == (nk_font_glyph *)0x0) {
    __assert_fail("atlas->glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2b3e,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  (atlas->custom).w = 0xb5;
  (atlas->custom).h = 0x1c;
  pnVar72 = atlas->config;
  if (pnVar72 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274f,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  local_3e0 = (ulong)atlas->font_num;
  if (atlas->font_num == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2750,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  iVar84 = 0;
  iVar46 = 0;
  tag_06 = extraout_RDX;
  for (pnVar70 = pnVar72; pnVar70 != (nk_font_config *)0x0; pnVar70 = pnVar70->next) {
    iVar100 = nk_range_count(pnVar70->range);
    iVar84 = iVar84 + iVar100;
    iVar100 = nk_range_glyph_count(pnVar70->range,iVar100);
    iVar46 = iVar46 + iVar100;
    tag_06 = extraout_RDX_00;
  }
  pvVar78 = alloc[9].ptr;
  local_458 = 0;
  pnVar70 = pnVar72;
  local_310 = pvVar59;
  do {
    if (pnVar70 == (nk_font_config *)0x0) {
      *height = 0;
      uVar85 = (uint)(1000 < iVar46) * 0x200;
      iVar100 = uVar85 + 0x200;
      *width = iVar100;
      uVar96 = uVar85 | 0x1ff;
      puVar61 = (uint *)(*(atlas->temporary).alloc)((atlas->temporary).userdata,(void *)0x0,0x48);
      pvVar59 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(ulong)(uVar96 << 4));
      if ((puVar61 == (uint *)0x0) || (pvVar59 == (void *)0x0)) {
        if (puVar61 != (uint *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,puVar61);
        }
        if (pvVar59 != (void *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar59);
        }
      }
      else {
        alloc[4].id = iVar100;
        *(undefined4 *)((long)alloc + 0x24) = 0x8000;
        alloc[7].ptr = (void *)0x0;
        alloc[3].ptr = puVar61;
        alloc[8].ptr = pvVar59;
        *(undefined4 *)((long)alloc + 0x2c) = 1;
        alloc[5].id = iVar100;
        alloc[6].ptr = (void *)0x100000001;
        uVar85 = uVar85 + 0x1fe;
        uVar82 = (ulong)uVar85;
        pvVar78 = pvVar59;
        while( true ) {
          bVar101 = uVar82 == 0;
          uVar82 = uVar82 - 1;
          if (bVar101) break;
          *(void **)((long)pvVar78 + 8) = (void *)((long)pvVar78 + 0x10);
          pvVar78 = (void *)((long)pvVar78 + 0x10);
        }
        *(undefined8 *)((long)pvVar59 + (ulong)uVar85 * 0x10 + 8) = 0;
        puVar61[3] = 1;
        puVar61[4] = 0;
        *(void **)(puVar61 + 8) = pvVar59;
        *(uint **)(puVar61 + 6) = puVar61 + 10;
        *puVar61 = uVar96;
        puVar61[1] = 0x7fff;
        puVar61[5] = uVar96;
        puVar61[2] = (uVar96 + uVar85) / uVar96;
        puVar61[10] = 0;
        *(uint **)(puVar61 + 0xc) = puVar61 + 0xe;
        *(short *)(puVar61 + 0xe) = (short)uVar96;
        *(undefined2 *)((long)puVar61 + 0x3a) = 0xffff;
        puVar61[0x10] = 0;
        puVar61[0x11] = 0;
      }
      local_3b0 = alloc + 3;
      nk_zero((nk_rp_rect *)&x0,0x10);
      nStack_234 = (atlas->custom).w * 2 + 1;
      nStack_232 = (atlas->custom).h + 1;
      alloc[6].ptr = (void *)0x100000001;
      nk_rp_pack_rects((nk_rp_context *)alloc[3].ptr,(nk_rp_rect *)&x0,1);
      iVar100 = ((uint)(CONCAT44(uStack_230,CONCAT22(nStack_232,nStack_234)) >> 0x10) & 0xffff) +
                (uStack_230 >> 0x10);
      if (iVar100 < *height) {
        iVar100 = *height;
      }
      *height = iVar100;
      nVar106.w = nStack_234;
      nVar106.h = nStack_232;
      nVar106.x = (undefined2)uStack_230;
      nVar106.y = uStack_230._2_2_;
      atlas->custom = nVar106;
      lVar98 = 0;
      uVar82 = 0;
      iVar100 = 0;
      iVar92 = 0;
      for (; (lVar98 < (long)local_3e0 && (pnVar72 != (nk_font_config *)0x0));
          pnVar72 = pnVar72->next) {
        pnVar62 = (nk_tt_fontinfo *)(lVar98 * 0x48 + (long)alloc[9].ptr);
        pnVar12 = pnVar72->range;
        lVar83 = 0;
        local_3d8 = 0;
        while ((pnVar12[lVar83 * 2] != 0 && (pnVar12[lVar83 * 2 + 1] != 0))) {
          local_3d8 = (ulong)(((int)local_3d8 - pnVar12[lVar83 * 2]) + pnVar12[lVar83 * 2 + 1] + 1);
          lVar83 = lVar83 + 1;
        }
        pfVar71 = (float *)(uVar82 * 0x28 + (long)alloc[0xc].ptr);
        *(float **)&pnVar62[1].fontstart = pfVar71;
        pnVar62[1].loca = (int)lVar83;
        for (lVar79 = 0; lVar83 != lVar79; lVar79 = lVar79 + 1) {
          *pfVar71 = pnVar72->size;
          fVar103 = (float)pnVar12[lVar79 * 2];
          pfVar71[1] = fVar103;
          iVar90 = pnVar12[lVar79 * 2 + 1] - (int)fVar103;
          pfVar71[4] = (float)(iVar90 + 1);
          *(void **)(pfVar71 + 6) = (void *)((long)iVar92 * 0x1c + (long)alloc[10].ptr);
          iVar92 = iVar90 + iVar92 + 1;
          pfVar71 = pfVar71 + 10;
        }
        local_3c0 = (nk_font_glyph *)CONCAT44(local_3c0._4_4_,iVar100);
        pnVar62[1].data = (uchar *)((long)iVar100 * 0x10 + (long)alloc[0xb].ptr);
        local_3d0 = uVar82;
        local_388 = lVar98;
        nk_tt_PackSetOversampling
                  ((nk_tt_pack_context *)local_3b0,(uint)pnVar72->oversample_h,
                   (uint)pnVar72->oversample_v);
        local_380._0_4_ = (float)pnVar62[1].fontstart;
        local_380._4_4_ = pnVar62[1].numGlyphs;
        uVar80 = 0;
        uVar82 = (ulong)(uint)pnVar62[1].loca;
        if (pnVar62[1].loca < 1) {
          uVar82 = uVar80;
        }
        local_328._0_8_ = pnVar62[1].data + 6;
        uVar88 = 0;
        for (; lVar98 = local_380, iVar100 = (int)uVar88, uVar80 != uVar82; uVar80 = uVar80 + 1) {
          fVar103 = *(float *)(local_380 + uVar80 * 0x28);
          if (fVar103 <= 0.0) {
            fVar103 = -fVar103 /
                      (float)(ushort)(*(ushort *)(pnVar62->data + (long)pnVar62->head + 0x12) << 8 |
                                     *(ushort *)(pnVar62->data + (long)pnVar62->head + 0x12) >> 8);
          }
          else {
            fVar103 = nk_tt_ScaleForPixelHeight(pnVar62,fVar103);
          }
          lVar98 = uVar80 * 0x28 + lVar98;
          *(undefined1 *)(lVar98 + 0x20) = *(undefined1 *)(alloc + 6);
          *(undefined1 *)(lVar98 + 0x21) = *(undefined1 *)((long)alloc + 0x34);
          psVar97 = (short *)((long)iVar100 * 0x10 + local_328._0_8_);
          for (lVar79 = 0; lVar79 < *(int *)(lVar98 + 0x10); lVar79 = lVar79 + 1) {
            if (*(int *)(lVar98 + 4) == 0) {
              iVar90 = *(int *)(*(long *)(lVar98 + 8) + lVar79 * 4);
            }
            else {
              iVar90 = *(int *)(lVar98 + 4) + (int)lVar79;
            }
            iVar90 = nk_tt_FindGlyphIndex(pnVar62,iVar90);
            uVar85 = alloc[6].id;
            uVar96 = *(uint *)((long)alloc + 0x34);
            nk_tt_GetGlyphBitmapBoxSubpixel
                      (pnVar62,iVar90,(float)uVar85 * fVar103,(float)uVar96 * fVar103,fVar103,
                       in_XMM3._0_4_,&x0,&y0,&x1,(int *)&local_3b8);
            sVar18 = (short)*(undefined4 *)((long)alloc + 0x2c);
            psVar97[-1] = (((short)_x1 + (short)uVar85) - (short)x0) + sVar18 + -1;
            *psVar97 = ~(ushort)y0 + sVar18 + (short)uVar96 + (short)(int)local_3b8;
            psVar97 = psVar97 + 8;
          }
          uVar88 = (ulong)(uint)(iVar100 + (int)lVar79);
        }
        nk_rp_pack_rects((nk_rp_context *)local_3b0->ptr,(nk_rp_rect *)pnVar62[1].data,iVar100);
        if (iVar100 < 1) {
          uVar88 = 0;
        }
        for (lVar98 = 0; uVar88 * 0x10 != lVar98; lVar98 = lVar98 + 0x10) {
          puVar13 = pnVar62[1].data;
          if (*(int *)(puVar13 + lVar98 + 0xc) != 0) {
            iVar100 = (uint)*(ushort *)(puVar13 + lVar98 + 6) +
                      (uint)*(ushort *)(puVar13 + lVar98 + 10);
            if ((int)((uint)*(ushort *)(puVar13 + lVar98 + 6) +
                     (uint)*(ushort *)(puVar13 + lVar98 + 10)) < *height) {
              iVar100 = *height;
            }
            *height = iVar100;
          }
        }
        uVar82 = (ulong)(uint)((int)local_3d0 + (int)lVar83);
        iVar100 = (int)local_3d8 + (int)local_3c0;
        lVar98 = local_388 + 1;
      }
      if (iVar100 != iVar46) {
        __assert_fail("rect_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27a7,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if (iVar92 != iVar46) {
        __assert_fail("char_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27a8,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if ((int)uVar82 != iVar84) {
        __assert_fail("range_n == total_range_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27a9,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      nVar47 = nk_round_up_pow2(*height);
      *height = nVar47;
      pvVar59 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(long)(int)nVar47 * (long)*width)
      ;
      atlas->pixel = pvVar59;
      if (pvVar59 == (void *)0x0) {
        __assert_fail("atlas->pixel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x2b4b,
                      "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                     );
      }
      iVar84 = *width;
      lVar98 = (long)iVar84;
      if (lVar98 == 0) {
        __assert_fail("width",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27ba,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      iVar46 = *height;
      local_3c4 = iVar46;
      if (iVar46 == 0) {
        __assert_fail("height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27bb,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      pnVar72 = atlas->config;
      if (pnVar72 == (nk_font_config *)0x0) {
        __assert_fail("config_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27bc,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (alloc == (nk_handle *)0x0) {
        __assert_fail("baker",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27bd,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      local_318 = (long)atlas->font_num;
      if (atlas->font_num == 0) {
        __assert_fail("font_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27be,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (atlas->glyph_count == 0) {
        __assert_fail("glyphs_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x27bf,
                      "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                     );
      }
      if (atlas->glyphs == (nk_font_glyph *)0x0) {
        iVar46 = SUB84(atlas->custom,0);
      }
      else {
        local_3c0 = atlas->glyphs;
        local_2d8 = lVar98;
        nk_zero(pvVar59,iVar46 * lVar98);
        alloc[7].ptr = pvVar59;
        *(int *)((long)alloc + 0x24) = iVar46;
        lVar98 = 0;
        pnVar70 = pnVar72;
        local_3a8 = pnVar72;
        while ((lVar98 < local_318 && (pnVar72 != (nk_font_config *)0x0))) {
          pvVar59 = alloc[9].ptr;
          lVar83 = lVar98 * 0x48;
          local_3a0 = (nk_tt_fontinfo *)((long)pvVar59 + lVar83);
          local_2d0 = pnVar72;
          local_2c8 = lVar98;
          nk_tt_PackSetOversampling
                    ((nk_tt_pack_context *)local_3b0,(uint)pnVar72->oversample_h,
                     (uint)pnVar72->oversample_v);
          auVar124 = (undefined1  [16])0x0;
          lVar98 = *(long *)((long)pvVar59 + lVar83 + 0x30);
          local_308 = *(long *)((long)pvVar59 + lVar83 + 0x38);
          uVar85 = *(uint *)((long)pvVar59 + lVar83 + 0x40);
          local_268 = alloc[6];
          uStack_260 = 0;
          if ((int)uVar85 < 1) {
            uVar85 = 0;
          }
          local_2c0 = (ulong)uVar85;
          lVar83 = 0;
          uVar82 = 0;
          pnVar70 = local_3a8;
          local_2f8 = lVar98;
          while (uVar82 != local_2c0) {
            fVar103 = *(float *)(local_308 + uVar82 * 0x28);
            local_2b8 = uVar82;
            if (fVar103 <= 0.0) {
              uStack_2e4 = 0x80000000;
              uStack_2e0 = 0x80000000;
              uStack_2dc = 0x80000000;
              local_2e8 = -fVar103 /
                          (float)(ushort)(*(ushort *)
                                           (local_3a0->data + (long)local_3a0->head + 0x12) << 8 |
                                         *(ushort *)(local_3a0->data + (long)local_3a0->head + 0x12)
                                         >> 8);
            }
            else {
              local_2e8 = nk_tt_ScaleForPixelHeight(local_3a0,fVar103);
              auVar124 = (undefined1  [16])0x0;
              uStack_2e4 = extraout_XMM0_Db;
              uStack_2e0 = extraout_XMM0_Dc;
              uStack_2dc = extraout_XMM0_Dd;
            }
            lVar79 = uVar82 * 0x28 + local_308;
            uVar82 = *(ulong *)(lVar79 + 0x20);
            auVar36._8_6_ = 0;
            auVar36._0_8_ = uVar82;
            auVar36[0xe] = (char)(uVar82 >> 0x38);
            auVar38._8_4_ = 0;
            auVar38._0_8_ = uVar82;
            auVar38[0xc] = (char)(uVar82 >> 0x30);
            auVar38._13_2_ = auVar36._13_2_;
            auVar39._8_4_ = 0;
            auVar39._0_8_ = uVar82;
            auVar39._12_3_ = auVar38._12_3_;
            auVar40._8_2_ = 0;
            auVar40._0_8_ = uVar82;
            auVar40[10] = (char)(uVar82 >> 0x28);
            auVar40._11_4_ = auVar39._11_4_;
            auVar41._8_2_ = 0;
            auVar41._0_8_ = uVar82;
            auVar41._10_5_ = auVar40._10_5_;
            auVar42[8] = (char)(uVar82 >> 0x20);
            auVar42._0_8_ = uVar82;
            auVar42._9_6_ = auVar41._9_6_;
            cVar115 = (char)(uVar82 >> 0x18);
            Var29 = CONCAT91((unkuint9)auVar42._8_7_ << 8,cVar115);
            auVar35[10] = 0;
            auVar35._0_10_ = Var29;
            cVar114 = (char)(uVar82 >> 0x10);
            auVar28._1_11_ = auVar35 << 8;
            auVar28[0] = cVar114;
            auVar34[0xc] = 0;
            auVar34._0_12_ = auVar28;
            cVar113 = (char)(uVar82 >> 8);
            auVar27._1_13_ = auVar34 << 8;
            auVar27[0] = cVar113;
            bVar102 = (byte)uVar82;
            uVar136 = CONCAT11(0,bVar102);
            auVar107._2_14_ = auVar27;
            sVar119 = 1 - auVar27._0_2_;
            sVar18 = -auVar28._0_2_;
            uVar69 = (ushort)Var29;
            sVar19 = -uVar69;
            auVar37._10_2_ = 0;
            auVar37._0_10_ = auVar107._0_10_;
            auVar37._12_2_ = uVar69;
            uVar43 = CONCAT42(auVar37._10_4_,auVar28._0_2_);
            auVar30._2_10_ = (unkuint10)uVar43 << 0x10;
            auVar30._0_2_ = auVar27._0_2_;
            auVar129._0_4_ = CONCAT22(0,uVar136);
            auVar129._4_12_ = auVar30;
            alloc[6] = auVar129._0_8_;
            auVar108._0_4_ = (float)auVar129._0_4_;
            auVar108._4_4_ = (float)auVar30._0_4_;
            auVar108._8_4_ = (float)(int)uVar43;
            auVar108._12_4_ = (float)uVar69;
            auVar129 = divps(_DAT_0014c140,auVar108);
            auVar130[0] = -(bVar102 == 0);
            auVar130[1] = -(bVar102 == 0);
            auVar130[2] = -(bVar102 == 0);
            auVar130[3] = -(bVar102 == 0);
            auVar130[4] = -(cVar113 == '\0');
            auVar130[5] = -(cVar113 == '\0');
            auVar130[6] = -(cVar113 == '\0');
            auVar130[7] = -(cVar113 == '\0');
            auVar130[8] = -(cVar114 == auVar124[8]);
            auVar130[9] = -(cVar114 == auVar124[9]);
            auVar130[10] = -(cVar114 == auVar124[10]);
            auVar130[0xb] = -(cVar114 == auVar124[0xb]);
            auVar130[0xc] = -(cVar115 == auVar124[0xc]);
            auVar130[0xd] = -(cVar115 == auVar124[0xd]);
            auVar130[0xe] = -(cVar115 == auVar124[0xe]);
            auVar130[0xf] = -(cVar115 == '\0');
            Var33 = CONCAT64(CONCAT42(CONCAT22(sVar19,sVar19),sVar18),CONCAT22(sVar18,sVar19));
            auVar31._4_8_ = (long)((unkuint10)Var33 >> 0x10);
            auVar31._2_2_ = sVar119;
            auVar31._0_2_ = sVar119;
            auVar117._0_4_ = (float)(int)(short)(1 - uVar136);
            auVar117._4_4_ = (float)(auVar31._0_4_ >> 0x10);
            auVar117._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
            auVar117._12_4_ = (float)(int)sVar19;
            auVar109._0_4_ = auVar108._0_4_ + auVar108._0_4_;
            auVar109._4_4_ = auVar108._4_4_ + auVar108._4_4_;
            auVar109._8_4_ = auVar108._8_4_ + auVar108._8_4_;
            auVar109._12_4_ = auVar108._12_4_ + auVar108._12_4_;
            local_248 = divps(auVar117,auVar109);
            local_248 = ~auVar130 & local_248;
            lVar83 = (long)(int)lVar83;
            lVar63 = 0;
            local_2f0 = lVar79;
            local_258 = auVar129;
LAB_00120b4e:
            pnVar62 = local_3a0;
            fVar103 = auVar129._0_4_;
            if (lVar63 < *(int *)(lVar79 + 0x10)) {
              if (*(int *)(lVar98 + 0xc + lVar83 * 0x10) != 0) {
                if (*(int *)(lVar79 + 4) == 0) {
                  iVar84 = *(int *)(*(long *)(lVar79 + 8) + lVar63 * 4);
                }
                else {
                  iVar84 = *(int *)(lVar79 + 4) + (int)lVar63;
                }
                uVar82 = lVar83 * 0x10 + lVar98;
                local_288 = (undefined4 *)(lVar63 * 0x1c + *(long *)(lVar79 + 0x18));
                local_280 = lVar83;
                iVar46 = nk_tt_FindGlyphIndex(local_3a0,iVar84);
                uVar3 = *(undefined8 *)(uVar82 + 4);
                auVar124 = pshuflw(ZEXT416(*(uint *)((long)alloc + 0x2c)),
                                   ZEXT416(*(uint *)((long)alloc + 0x2c)),0);
                uVar122 = (short)uVar3 - auVar124._0_2_;
                uVar126 = (short)((ulong)uVar3 >> 0x10) - auVar124._2_2_;
                uVar120 = (short)((ulong)uVar3 >> 0x20) + auVar124._4_2_;
                uVar121 = (short)((ulong)uVar3 >> 0x30) + auVar124._6_2_;
                *(ulong *)(uVar82 + 4) =
                     CONCAT44(CONCAT22(uVar121,uVar120),CONCAT22(uVar126,uVar122));
                puVar13 = pnVar62->data;
                uVar69 = *(ushort *)(puVar13 + (long)pnVar62->hhea + 0x22) << 8 |
                         *(ushort *)(puVar13 + (long)pnVar62->hhea + 0x22) >> 8;
                iVar84 = pnVar62->hmtx;
                lVar98 = (ulong)uVar69 * 4 + (long)iVar84 + -4;
                lVar83 = (ulong)uVar69 * 4 + (long)iVar84 + -3;
                if (iVar46 < (int)(uint)uVar69) {
                  lVar98 = (long)(iVar46 * 4) + (long)iVar84;
                  lVar83 = (long)(iVar46 * 4) + 1 + (long)iVar84;
                }
                local_370 = (uint)puVar13[lVar98];
                local_374 = (uint)puVar13[lVar83];
                uVar85 = alloc[6].id;
                uVar96 = *(uint *)((long)alloc + 0x34);
                fVar104 = (float)uVar85 * local_2e8;
                fVar116 = (float)uVar96 * local_2e8;
                local_3d8 = uVar82;
                fVar105 = local_2e8;
                nk_tt_GetGlyphBitmapBoxSubpixel
                          (pnVar62,iVar46,fVar104,fVar116,local_2e8,fVar103,&x0_1,&y0_1,&x1_1,
                           &local_270);
                pvVar59 = alloc[7].ptr;
                iVar84 = alloc[5].id;
                iVar100 = uVar122 - uVar85;
                uVar85 = nk_tt_GetGlyphShape(pnVar62,(nk_allocator *)alloc,iVar46,
                                             (nk_tt_vertex **)&local_3b8);
                nk_tt_GetGlyphBitmapBoxSubpixel
                          (pnVar62,iVar46,fVar104,fVar116,fVar105,fVar103,&ix0,&iy0,(int *)0x0,
                           (int *)0x0);
                iVar46 = ix0;
                uVar54 = iVar100 + 1;
                if ((uVar54 != 0) &&
                   (uVar96 = (uVar126 - uVar96) + 1, local_390 = (ulong)uVar96, uVar96 != 0)) {
                  lVar98 = CONCAT44(local_3b8._4_4_,(int)local_3b8);
                  local_3e0 = (ulong)(uint)iy0;
                  uVar80 = 0;
                  uVar82 = (ulong)uVar85;
                  if ((int)uVar85 < 1) {
                    uVar82 = uVar80;
                  }
                  uVar88 = 0;
                  for (; uVar82 * 10 - uVar80 != 0; uVar80 = uVar80 + 10) {
                    uVar88 = (ulong)((int)uVar88 + (uint)(*(char *)(lVar98 + 8 + uVar80) == '\x01'))
                    ;
                  }
                  if (((int)uVar88 != 0) &&
                     (pvVar78 = (*alloc[1])(*alloc,(void *)0x0,uVar88 * 4), pvVar78 != (void *)0x0))
                  {
                    fVar103 = fVar116;
                    if (fVar104 <= fVar116) {
                      fVar103 = fVar104;
                    }
                    points = (nk_tt__point *)0x0;
                    iVar90 = 0;
                    iVar86 = 0;
                    iVar92 = 0;
                    local_290 = (long)pvVar59 + (long)(int)((uint)uVar121 * iVar84) + (ulong)uVar120
                    ;
                    do {
                      if (iVar86 == 1) {
                        points = (nk_tt__point *)
                                 (*(code *)alloc[1])(*alloc,(void *)0x0,(long)iVar92 << 3);
                        if (points == (nk_tt__point *)0x0) {
                          (*(code *)alloc[2])(*alloc,(void *)0x0);
                          (*(code *)alloc[2])(*alloc,pvVar78);
                          break;
                        }
                      }
                      else if (iVar86 == 2) goto LAB_00120fb6;
                      x0 = 0;
                      fVar105 = 0.0;
                      fVar128 = 0.0;
                      uVar85 = 0xffffffff;
                      for (lVar83 = 0; uVar82 * 10 - lVar83 != 0; lVar83 = lVar83 + 10) {
                        cVar113 = *(char *)(lVar98 + 8 + lVar83);
                        if (cVar113 == '\x03') {
                          nk_tt__tesselate_curve
                                    (points,&x0,fVar105,fVar128,
                                     (float)(int)*(short *)(lVar98 + 4 + lVar83),
                                     (float)(int)*(short *)(lVar98 + 6 + lVar83),
                                     (float)(int)*(short *)(lVar98 + lVar83),
                                     (float)(int)*(short *)(lVar98 + 2 + lVar83),
                                     (0.35 / fVar103) * (0.35 / fVar103),0);
                          auVar124 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar83)),
                                             ZEXT416(*(uint *)(lVar98 + lVar83)),0x60);
                          fVar105 = (float)(auVar124._0_4_ >> 0x10);
                          fVar128 = (float)(auVar124._4_4_ >> 0x10);
                          iVar92 = x0;
                        }
                        else if (cVar113 == '\x02') {
                          auVar124 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar83)),
                                             ZEXT416(*(uint *)(lVar98 + lVar83)),0x60);
                          fVar105 = (float)(auVar124._0_4_ >> 0x10);
                          fVar128 = (float)(auVar124._4_4_ >> 0x10);
                          iVar92 = x0 + 1;
                          if (points != (nk_tt__point *)0x0) {
                            points[x0].x = fVar105;
                            points[x0].y = fVar128;
                          }
                        }
                        else {
                          iVar92 = x0;
                          if (cVar113 == '\x01') {
                            if (-1 < (int)uVar85) {
                              *(int *)((long)pvVar78 + (ulong)uVar85 * 4) = x0 - iVar90;
                            }
                            uVar85 = uVar85 + 1;
                            auVar124 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar83)),
                                               ZEXT416(*(uint *)(lVar98 + lVar83)),0x60);
                            fVar105 = (float)(auVar124._0_4_ >> 0x10);
                            fVar128 = (float)(auVar124._4_4_ >> 0x10);
                            iVar90 = x0;
                            iVar92 = x0 + 1;
                            if (points != (nk_tt__point *)0x0) {
                              points[x0].x = fVar105;
                              points[x0].y = fVar128;
                            }
                          }
                        }
                        x0 = iVar92;
                      }
                      *(int *)((long)pvVar78 + (long)(int)uVar85 * 4) = x0 - iVar90;
                      iVar86 = iVar86 + 1;
                      iVar92 = x0;
                    } while( true );
                  }
                }
                goto LAB_00120fff;
              }
              goto LAB_00121501;
            }
            uVar82 = local_2b8 + 1;
          }
          alloc[6] = local_268;
          lVar98 = local_2c8 + 1;
          pnVar72 = local_2d0->next;
        }
        (*(code *)alloc[2])(*alloc,alloc[8].ptr);
        (*(code *)alloc[2])(*alloc,alloc[3].ptr);
        fVar103 = (float)(int)local_2d8;
        fVar105 = (float)local_3c4;
        auVar135._8_8_ = 0x3f8000003f800000;
        auVar135._0_8_ = 0x3f8000003f800000;
        auVar17._4_4_ = fVar105;
        auVar17._0_4_ = fVar103;
        auVar17._8_4_ = fVar103;
        auVar17._12_4_ = fVar105;
        auVar124 = divps(auVar135,auVar17);
        lVar98 = 0;
        local_458._0_4_ = 0;
        for (; (lVar98 < local_318 && (pnVar70 != (nk_font_config *)0x0)); pnVar70 = pnVar70->next)
        {
          pnVar15 = pnVar70->font;
          pnVar62 = (nk_tt_fontinfo *)(lVar98 * 0x48 + (long)alloc[9].ptr);
          if (pnVar70->merge_mode == '\0') {
            puVar13 = pnVar62->data;
            lVar83 = (long)pnVar62->hhea;
            bVar102 = puVar13[lVar83 + 7];
            uVar8 = puVar13[lVar83 + 4];
            bVar7 = puVar13[lVar83 + 5];
            fVar104 = pnVar70->size;
            uVar9 = puVar13[lVar83 + 6];
            fVar116 = nk_tt_ScaleForPixelHeight(pnVar62,fVar104);
            pnVar15->ranges = pnVar70->range;
            pnVar15->height = fVar104;
            auVar23._9_7_ = 0;
            auVar23._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar22._10_6_ = 0;
            auVar22._0_10_ = SUB1610(auVar23 << 0x38,6);
            auVar21._11_5_ = 0;
            auVar21._0_11_ = SUB1611(auVar22 << 0x30,5);
            auVar24._1_12_ = SUB1612(auVar21 << 0x28,4);
            auVar24[0] = uVar9;
            auVar24._13_3_ = 0;
            auVar20._1_14_ = SUB1614(auVar24 << 0x18,2);
            auVar20[0] = uVar8;
            auVar20[0xf] = 0;
            auVar129 = ZEXT416((uint)bVar102 * 0x10000 + (uint)bVar7) | auVar20 << 8;
            pnVar15->ascent = fVar116 * (float)(int)auVar129._0_2_;
            pnVar15->descent = fVar116 * (float)(int)auVar129._2_2_;
            pnVar15->glyph_offset = (nk_rune)local_458;
          }
          uVar85 = pnVar62[1].loca;
          nVar57 = 0;
          for (uVar82 = 0; uVar82 != uVar85; uVar82 = uVar82 + 1) {
            lVar83 = *(long *)&pnVar62[1].fontstart + uVar82 * 0x28;
            uVar96 = *(uint *)(*(long *)&pnVar62[1].fontstart + 0x10 + uVar82 * 0x28);
            uVar88 = 0;
            uVar80 = (ulong)uVar96;
            if ((int)uVar96 < 1) {
              uVar80 = uVar88;
            }
            iVar84 = 0;
            for (; uVar80 * 0x1c - uVar88 != 0; uVar88 = uVar88 + 0x1c) {
              lVar79 = *(long *)(lVar83 + 0x18);
              uVar69 = *(ushort *)(lVar79 + 2 + uVar88);
              uVar120 = *(ushort *)(lVar79 + 4 + uVar88);
              if (*(ushort *)(lVar79 + uVar88) == 0 && uVar120 == 0) {
                fVar104 = 0.0;
                if (uVar69 != 0) goto LAB_00122546;
                if (*(short *)(lVar79 + 6 + uVar88) != 0) {
                  uVar69 = 0;
                  goto LAB_00122546;
                }
              }
              else {
                fVar104 = (float)uVar120;
LAB_00122546:
                fVar123 = *(float *)(lVar79 + 8 + uVar88) + 0.0;
                fVar116 = *(float *)(lVar79 + 0xc + uVar88);
                fVar134 = *(float *)(lVar79 + 0x14 + uVar88) + 0.0;
                fVar128 = *(float *)(lVar79 + 0x18 + uVar88);
                fVar133 = (float)*(ushort *)(lVar79 + uVar88) * auVar124._0_4_;
                fVar131 = (float)uVar69 * auVar124._4_4_;
                fVar104 = fVar104 * auVar124._8_4_;
                fVar132 = (float)*(ushort *)(lVar79 + 6 + uVar88) * auVar124._12_4_;
                uVar96 = pnVar15->glyph_offset + nVar57;
                local_3c0[uVar96].codepoint = *(int *)(lVar83 + 4) + iVar84;
                local_3c0[uVar96].x0 = fVar123;
                local_3c0[uVar96].x1 = fVar134;
                fVar127 = pnVar15->ascent + 0.5;
                fVar116 = fVar116 + 0.0 + fVar127;
                local_3c0[uVar96].y0 = fVar116;
                fVar127 = fVar127 + fVar128 + 0.0;
                local_3c0[uVar96].y1 = fVar127;
                local_3c0[uVar96].w = (fVar134 - fVar123) + 0.5;
                local_3c0[uVar96].h = fVar127 - fVar116;
                if (pnVar70->coord_type == NK_COORD_PIXEL) {
                  fVar133 = fVar133 * fVar103;
                  fVar131 = fVar131 * fVar105;
                  fVar104 = fVar104 * fVar103;
                  fVar132 = fVar132 * fVar105;
                }
                pfVar71 = &local_3c0[uVar96].u0;
                *pfVar71 = fVar133;
                pfVar71[1] = fVar131;
                pfVar71[2] = fVar104;
                pfVar71[3] = fVar132;
                fVar104 = *(float *)(lVar79 + 0x10 + uVar88) + (pnVar70->spacing).x;
                local_3c0[uVar96].xadvance = fVar104;
                if (pnVar70->pixel_snap != '\0') {
                  local_3c0[uVar96].xadvance = (float)(int)(fVar104 + 0.5);
                }
                nVar57 = nVar57 + 1;
              }
              iVar84 = iVar84 + 1;
            }
          }
          pnVar15->glyph_count = nVar57;
          local_458._0_4_ = (nk_rune)local_458 + nVar57;
          lVar98 = lVar98 + 1;
        }
        pvVar59 = atlas->pixel;
        if (pvVar59 == (void *)0x0) {
          __assert_fail("img_memory",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2828,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        iVar84 = *width;
        if (iVar84 == 0) {
          __assert_fail("img_width",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2829,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        if (*height == 0) {
          __assert_fail("img_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x282a,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        iVar46 = SUB84(atlas->custom,0);
      }
      iVar46 = (iVar46 >> 0x10) * iVar84 + (int)(short)iVar46;
      lVar98 = 0;
      for (iVar100 = 0; iVar100 != 0x1b; iVar100 = iVar100 + 1) {
        for (lVar83 = 0; lVar83 != 0x5a; lVar83 = lVar83 + 1) {
          cVar113 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                    [(int)lVar98 + lVar83];
          lVar79 = (long)(iVar46 + (int)lVar83);
          *(char *)((long)pvVar59 + lVar79) = -(cVar113 == '.');
          *(char *)((long)pvVar59 + lVar79 + 0x5b) = -(cVar113 == 'X');
        }
        iVar46 = iVar46 + iVar84;
        lVar98 = (long)(int)lVar98 + 0x5a;
      }
      iVar84 = *width;
      if (local_378 == NK_FONT_ATLAS_RGBA32) {
        pvVar59 = (*(atlas->temporary).alloc)
                            ((atlas->temporary).userdata,(void *)0x0,(long)(iVar84 * *height * 4));
        if (pvVar59 == (void *)0x0) {
          __assert_fail("img_rgba",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2b59,
                        "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                       );
        }
        pvVar78 = atlas->pixel;
        if (pvVar78 == (void *)0x0) {
          __assert_fail("in_memory",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2844,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        if (*width == 0) {
          __assert_fail("img_width",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2845,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        if (*height == 0) {
          __assert_fail("img_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2846,"void nk_font_bake_convert(void *, int, int, const void *)");
        }
        lVar98 = 0;
        for (iVar84 = *height * *width; 0 < iVar84; iVar84 = iVar84 + -1) {
          *(uint *)((long)pvVar59 + lVar98 * 4) =
               (uint)*(byte *)((long)pvVar78 + lVar98) << 0x18 | 0xffffff;
          lVar98 = lVar98 + 1;
        }
        (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar78);
        atlas->pixel = pvVar59;
        iVar84 = *width;
      }
      atlas->tex_width = iVar84;
      atlas->tex_height = *height;
      pnVar58 = (nk_font *)&atlas->fonts;
      while( true ) {
        pnVar58 = pnVar58->next;
        if (pnVar58 == (nk_font *)0x0) {
          nVar106 = atlas->custom;
          auVar112._8_4_ = 0;
          auVar112._0_2_ = nVar106.x;
          auVar112._2_2_ = nVar106.y;
          auVar112._4_2_ = nVar106.w;
          auVar112._6_2_ = nVar106.h;
          auVar112._12_2_ = nVar106.h;
          auVar112._14_2_ = nVar106.h;
          auVar111._12_4_ = auVar112._12_4_;
          auVar111._8_2_ = 0;
          auVar111._0_2_ = nVar106.x;
          auVar111._2_2_ = nVar106.y;
          auVar111._4_2_ = nVar106.w;
          auVar111._6_2_ = nVar106.h;
          auVar111._10_2_ = nVar106.w;
          auVar110._10_6_ = auVar111._10_6_;
          auVar110._8_2_ = nVar106.w;
          auVar110._0_2_ = nVar106.x;
          auVar110._2_2_ = nVar106.y;
          auVar110._4_2_ = nVar106.w;
          auVar110._6_2_ = nVar106.h;
          auVar32._4_8_ = auVar110._8_8_;
          auVar32._2_2_ = nVar106.y;
          auVar32._0_2_ = nVar106.y;
          pnVar76 = nk_font_atlas_bake::nk_cursor_data[0] + 1;
          for (lVar98 = 0x60; lVar98 != 0x178; lVar98 = lVar98 + 0x28) {
            *(short *)((long)atlas->cursors[0].img.region + lVar98 + -100) = (short)*width;
            *(short *)((long)atlas->cursors[0].img.region + lVar98 + -0x62) = (short)*height;
            auVar118._0_4_ = (int)(pnVar76[-1].x + (float)(int)nVar106.x);
            auVar118._4_4_ = (int)(pnVar76[-1].y + (float)(auVar32._0_4_ >> 0x10));
            auVar118._8_4_ = (int)(*pnVar76).x;
            auVar118._12_4_ = (int)(*pnVar76).y;
            auVar124 = pshuflw(auVar118,auVar118,0xe8);
            auVar124 = pshufhw(auVar124,auVar124,0xe8);
            *(ulong *)((long)atlas->cursors[0].img.region + lVar98 + -0x60) =
                 CONCAT44(auVar124._8_4_,auVar124._0_4_);
            nVar26 = pnVar76[1];
            pnVar1 = (nk_vec2 *)((long)(&atlas->cursors[0].img + -3) + lVar98);
            *pnVar1 = *pnVar76;
            pnVar1[1] = nVar26;
            pnVar76 = pnVar76 + 3;
          }
          (*(atlas->temporary).free)((atlas->temporary).userdata,local_310);
          return atlas->pixel;
        }
        pnVar60 = atlas->glyphs;
        if (pnVar60 == (nk_font_glyph *)0x0) break;
        pnVar72 = pnVar58->config;
        pnVar15 = pnVar72->font;
        if (pnVar15 == (nk_baked_font *)0x0) {
          __assert_fail("baked_font",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x28b5,
                        "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                       );
        }
        fVar103 = pnVar72->size;
        nVar57 = pnVar72->fallback_glyph;
        fVar105 = pnVar15->ascent;
        fVar104 = pnVar15->descent;
        nVar44 = pnVar15->glyph_offset;
        nVar45 = pnVar15->glyph_count;
        uVar10 = *(undefined4 *)&pnVar15->field_0x14;
        pnVar12 = pnVar15->ranges;
        (pnVar58->info).height = pnVar15->height;
        (pnVar58->info).ascent = fVar105;
        (pnVar58->info).descent = fVar104;
        (pnVar58->info).glyph_offset = nVar44;
        (pnVar58->info).glyph_count = nVar45;
        *(undefined4 *)&(pnVar58->info).field_0x14 = uVar10;
        (pnVar58->info).ranges = pnVar12;
        pnVar58->scale = fVar103 / (pnVar58->info).height;
        pnVar58->glyphs = pnVar60 + pnVar15->glyph_offset;
        (pnVar58->texture).ptr = (void *)0x0;
        pnVar58->fallback_codepoint = nVar57;
        pnVar60 = nk_font_find_glyph(pnVar58,nVar57);
        pnVar58->fallback = pnVar60;
        (pnVar58->handle).height = (pnVar58->info).height * pnVar58->scale;
        (pnVar58->handle).width = nk_font_text_width;
        (pnVar58->handle).userdata.ptr = pnVar58;
        (pnVar58->handle).query = nk_font_query_font_glyph;
        (pnVar58->handle).texture = pnVar58->texture;
      }
      __assert_fail("glyphs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x28b4,
                    "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                   );
    }
    lVar98 = local_458 * 0x48;
    data = (nk_byte *)pnVar70->ttf_blob;
    *(nk_byte **)((long)pvVar78 + lVar98) = data;
    *(undefined4 *)((long)pvVar78 + lVar98 + 8) = 0;
    nVar47 = nk_tt__find_table(data,0x155614,tag_06);
    nVar48 = nk_tt__find_table(data,0x155619,tag);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x10) = nVar48;
    nVar49 = nk_tt__find_table(data,0x15561e,tag_00);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x14) = nVar49;
    nVar50 = nk_tt__find_table(data,0x155623,tag_01);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x18) = nVar50;
    nVar51 = nk_tt__find_table(data,0x155628,tag_02);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x1c) = nVar51;
    nVar52 = nk_tt__find_table(data,0x15562d,tag_03);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x20) = nVar52;
    nVar53 = nk_tt__find_table(data,0x155632,tag_04);
    *(nk_uint *)((long)pvVar78 + lVar98 + 0x24) = nVar53;
    if ((((nVar47 == 0) || (nVar48 == 0)) || (nVar49 == 0)) ||
       (((nVar50 == 0 || (nVar51 == 0)) || (nVar52 == 0)))) {
LAB_00120330:
      (*(atlas->temporary).free)((atlas->temporary).userdata,local_310);
      if (atlas->glyphs != (nk_font_glyph *)0x0) {
        (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
        atlas->glyphs = (nk_font_glyph *)0x0;
      }
      if (atlas->pixel != (void *)0x0) {
        (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
        atlas->pixel = (void *)0x0;
      }
      return (void *)0x0;
    }
    nVar48 = nk_tt__find_table(data,0x155637,tag_05);
    if (nVar48 == 0) {
      uVar85 = 0xffff;
    }
    else {
      uVar85 = (uint)(ushort)(*(ushort *)(data + (ulong)nVar48 + 4) << 8 |
                             *(ushort *)(data + (ulong)nVar48 + 4) >> 8);
    }
    *(uint *)((long)pvVar78 + lVar98 + 0xc) = uVar85;
    uVar69 = *(ushort *)(data + (ulong)nVar47 + 2);
    *(undefined4 *)((long)pvVar78 + lVar98 + 0x28) = 0;
    local_458 = local_458 + 1;
    uVar82 = (ulong)(ushort)(uVar69 << 8 | uVar69 >> 8);
    uVar85 = nVar47 + 4;
    iVar100 = 0;
    tag_06 = extraout_RDX_01;
    while( true ) {
      bVar101 = uVar82 == 0;
      uVar82 = uVar82 - 1;
      if (bVar101) break;
      uVar69 = *(ushort *)(data + uVar85) << 8 | *(ushort *)(data + uVar85) >> 8;
      if ((uVar69 == 0) ||
         ((uVar69 == 3 &&
          ((uVar69 = *(ushort *)(data + (ulong)uVar85 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar85 + 2) >> 8, uVar69 == 10 || (uVar69 == 1))))))
      {
        nVar48 = nk_ttULONG(data + (ulong)uVar85 + 4);
        iVar100 = nVar48 + nVar47;
        *(int *)((long)pvVar78 + lVar98 + 0x28) = iVar100;
        tag_06 = extraout_RDX_02;
      }
      uVar85 = uVar85 + 8;
    }
    if (iVar100 == 0) goto LAB_00120330;
    *(uint *)((long)pvVar78 + lVar98 + 0x2c) =
         (uint)(ushort)(*(ushort *)(data + (long)(int)nVar49 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)nVar49 + 0x32) >> 8);
    pnVar70 = pnVar70->next;
  } while( true );
LAB_00120fb6:
  if (points != (nk_tt__point *)0x0) {
    iVar92 = 0;
    for (uVar82 = 0; uVar88 != uVar82; uVar82 = uVar82 + 1) {
      iVar92 = iVar92 + *(int *)((long)pvVar78 + uVar82 * 4);
    }
    local_398 = points;
    pnVar64 = (nk_tt__edge *)(*(code *)alloc[1])(*alloc,(void *)0x0,(long)(iVar92 + 1) * 0x14);
    if (pnVar64 != (nk_tt__edge *)0x0) {
      iVar92 = 0;
      iVar90 = 0;
      for (uVar82 = 0; uVar82 != uVar88; uVar82 = uVar82 + 1) {
        iVar86 = *(int *)((long)pvVar78 + uVar82 * 4);
        uVar81 = (ulong)(iVar86 - 1);
        iVar95 = iVar86;
        for (uVar80 = 0; iVar93 = (int)uVar81, (long)uVar80 < (long)iVar95; uVar80 = uVar80 + 1) {
          fVar103 = local_398[(long)iVar92 + (long)iVar93].y;
          fVar105 = local_398[(long)iVar92 + uVar80].y;
          if ((fVar103 != fVar105) || (NAN(fVar103) || NAN(fVar105))) {
            iVar94 = (int)uVar80;
            iVar95 = iVar93;
            if (fVar103 <= fVar105) {
              iVar95 = iVar94;
              iVar94 = iVar93;
            }
            pnVar64[iVar90].invert = (uint)(fVar105 < fVar103);
            nVar4 = local_398[(long)iVar92 + (long)iVar95];
            nVar5 = local_398[(long)iVar92 + (long)iVar94];
            pnVar65 = pnVar64 + iVar90;
            pnVar65->x0 = nVar4.x * fVar104 + 0.0;
            pnVar65->y0 = nVar4.y * -fVar116 + 0.0;
            pnVar65->x1 = nVar5.x * fVar104 + 0.0;
            pnVar65->y1 = nVar5.y * -fVar116 + 0.0;
            iVar90 = iVar90 + 1;
            iVar95 = *(int *)((long)pvVar78 + uVar82 * 4);
          }
          uVar81 = uVar80 & 0xffffffff;
        }
        iVar92 = iVar86 + iVar92;
      }
      nk_tt__sort_edges_quicksort(pnVar64,iVar90);
      pnVar65 = pnVar64;
      for (uVar82 = 1; (long)uVar82 < (long)iVar90; uVar82 = uVar82 + 1) {
        uVar2 = pnVar64[uVar82].x0;
        uVar6 = pnVar64[uVar82].y0;
        uStack_230 = pnVar64[uVar82].invert;
        uVar11 = pnVar64[uVar82].x1;
        uVar16 = pnVar64[uVar82].y1;
        nStack_234 = (nk_rp_coord)uVar16;
        nStack_232 = (nk_rp_coord)((uint)uVar16 >> 0x10);
        pnVar89 = pnVar65;
        for (uVar80 = uVar82; 0 < (long)uVar80; uVar80 = uVar80 - 1) {
          if (pnVar89->y0 <= (float)uVar6) goto LAB_00121692;
          pnVar89[1].invert = pnVar89->invert;
          fVar103 = pnVar89->y0;
          fVar105 = pnVar89->x1;
          fVar104 = pnVar89->y1;
          pnVar89[1].x0 = pnVar89->x0;
          pnVar89[1].y0 = fVar103;
          pnVar89[1].x1 = fVar105;
          pnVar89[1].y1 = fVar104;
          pnVar89 = pnVar89 + -1;
        }
        uVar80 = 0;
LAB_00121692:
        iVar92 = (int)uVar80;
        if (uVar82 != (uVar80 & 0xffffffff)) {
          pnVar64[iVar92].x0 = (float)uVar2;
          pnVar64[iVar92].y0 = (float)uVar6;
          pnVar64[iVar92].x1 = (float)uVar11;
          pnVar64[iVar92].y1 = (float)uVar16;
          pnVar64[iVar92].invert = uStack_230;
        }
        pnVar65 = pnVar65 + 1;
        x0 = uVar11;
      }
      _x1 = (nk_tt__active_edge *)0x0;
      local_300 = pnVar64;
      nk_zero(&y0,0x30);
      local_348 = alloc[2];
      _y0 = *alloc;
      nStack_350 = alloc[1];
      pfVar71 = (float *)&x0;
      if (0x40 < (int)uVar54) {
        pfVar71 = (float *)(*(code *)alloc[1])(*alloc,(void *)0x0,(ulong)uVar54 * 8 + 4);
      }
      local_2a8 = (nk_size)(int)uVar54;
      iVar92 = (int)local_390;
      scanline = pfVar71 + local_2a8;
      local_300[iVar90].y0 = (float)((int)local_3e0 + iVar92) + 1.0;
      local_388 = CONCAT44(local_388._4_4_,(float)iVar46);
      local_298 = local_2a8 * 4;
      local_3d0 = CONCAT44(local_3d0._4_4_,(float)(int)uVar54);
      local_2a0 = (long)(iVar100 + 2) << 2;
      uVar82 = 0;
      uVar85 = 0;
      if (0 < (int)uVar54) {
        uVar85 = uVar54;
      }
      size_00 = 0;
      if (0 < (long)local_2a8) {
        size_00 = local_2a8;
      }
      local_390 = local_390 & 0xffffffff;
      if (iVar92 < 1) {
        local_390 = uVar82;
      }
      iVar46 = 0;
      uVar80 = local_3e0;
      pnVar64 = local_300;
      local_2b0 = size_00;
      while (puVar66 = local_340, iVar46 != (int)local_390) {
        fVar103 = (float)(int)uVar80;
        fVar105 = fVar103 + 1.0;
        local_3e0 = uVar80;
        nk_memset(pfVar71,(int)local_298,size_00);
        nk_memset(scanline,(int)local_2a0,size);
        pnVar74 = (nk_tt__active_edge *)&x1;
        while (pnVar73 = pnVar74, pnVar74 = pnVar73->next, pnVar74 != (nk_tt__active_edge *)0x0) {
          if (pnVar74->ey <= fVar103) {
            pnVar73->next = pnVar74->next;
            if ((pnVar74->direction == 0.0) && (!NAN(pnVar74->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                            ,0x23e9,
                            "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                           );
            }
            pnVar74->direction = 0.0;
            pnVar74->next = local_338;
            local_338 = pnVar74;
            pnVar74 = pnVar73;
          }
        }
        local_36c = iVar46;
        local_278 = uVar82;
        pnVar74 = _x1;
        for (; pnVar73 = local_338, fVar104 = pnVar64->y0, fVar104 <= fVar105; pnVar64 = pnVar64 + 1
            ) {
          fVar116 = pnVar64->y1;
          if ((fVar104 == fVar116) && (!NAN(fVar104) && !NAN(fVar116))) goto LAB_00121a08;
          if (local_338 == (nk_tt__active_edge *)0x0) {
            if (local_330 == 0) {
              puVar66 = (undefined8 *)(*(code *)nStack_350)(_y0,(void *)0x0,0x6408);
              if (puVar66 != (undefined8 *)0x0) {
                *puVar66 = local_340;
                local_340 = puVar66;
                local_330 = 799;
                fVar104 = pnVar64->y0;
                fVar116 = pnVar64->y1;
                goto LAB_0012196f;
              }
            }
            else {
              local_330 = local_330 + -1;
              if (local_340 != (undefined8 *)0x0) {
LAB_0012196f:
                pnVar73 = (nk_tt__active_edge *)(local_340 + (long)local_330 * 4);
                goto LAB_00121979;
              }
            }
          }
          else {
            local_338 = local_338->next;
LAB_00121979:
            fVar128 = pnVar64->x0;
            fVar127 = (pnVar64->x1 - fVar128) / (fVar116 - fVar104);
            pnVar73->fdx = fVar127;
            pnVar73->fdy = (float)(-(uint)(fVar127 != 0.0) & (uint)(1.0 / fVar127));
            pnVar73->fx = ((fVar103 - fVar104) * fVar127 + fVar128) - (float)local_388;
            pnVar73->direction = *(float *)(&DAT_0014c428 + (ulong)(pnVar64->invert == 0) * 4);
            pnVar73->sy = fVar104;
            pnVar73->ey = fVar116;
            pnVar73->next = (nk_tt__active_edge *)0x0;
            if (fVar116 < fVar103) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                            ,0x23f6,
                            "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                           );
            }
            pnVar73->next = pnVar74;
            pnVar74 = pnVar73;
          }
LAB_00121a08:
        }
        _x1 = pnVar74;
        if (pnVar74 != (nk_tt__active_edge *)0x0) {
          for (; pnVar74 != (nk_tt__active_edge *)0x0; pnVar74 = pnVar74->next) {
            fVar104 = pnVar74->ey;
            if (fVar104 < fVar103) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                            ,0x232b,
                            "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                           );
            }
            fVar116 = pnVar74->fx;
            fVar128 = pnVar74->fdx;
            if ((fVar128 != 0.0) || (NAN(fVar128))) {
              fVar127 = pnVar74->sy;
              if (fVar105 < fVar127) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                              ,0x233d,
                              "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                             );
              }
              fVar134 = fVar128 + fVar116;
              fVar123 = (float)(~-(uint)(fVar103 < fVar127) & (uint)fVar116 |
                               (uint)((fVar127 - fVar103) * fVar128 + fVar116) &
                               -(uint)(fVar103 < fVar127));
              if ((((fVar123 < 0.0) ||
                   (fVar133 = (float)(~-(uint)(fVar104 < fVar105) & (uint)fVar134 |
                                     (uint)((fVar104 - fVar103) * fVar128 + fVar116) &
                                     -(uint)(fVar104 < fVar105)), fVar133 < 0.0)) ||
                  ((float)local_3d0 <= fVar123)) || ((float)local_3d0 <= fVar133)) {
                local_328 = ZEXT416((uint)fVar116);
                local_380 = CONCAT44(local_380._4_4_,fVar128);
                uVar96 = 0;
                while (uVar85 != uVar96) {
                  fVar104 = (float)(int)uVar96;
                  fVar123 = (float)(int)(uVar96 + 1);
                  fVar127 = (fVar104 - fVar116) / fVar128 + fVar103;
                  fVar128 = ((fVar104 + 1.0) - fVar116) / fVar128 + fVar103;
                  if ((fVar104 <= fVar116) || (fVar134 <= fVar123)) {
                    if ((fVar104 <= fVar134) || (fVar116 <= fVar123)) {
                      fVar133 = fVar103;
                      if (((fVar104 <= fVar116) || (fVar134 <= fVar104)) &&
                         ((fVar104 <= fVar134 || (fVar116 <= fVar104)))) {
                        fVar127 = fVar103;
                        if (((fVar116 < fVar123) && (fVar123 < fVar134)) ||
                           ((fVar104 = fVar116, fVar134 < fVar123 && (fVar123 < fVar116))))
                        goto LAB_00121c7d;
                        goto LAB_00121d35;
                      }
                    }
                    else {
                      nk_tt__handle_clipped_edge
                                (pfVar71,uVar96,pnVar74,fVar116,fVar103,fVar123,fVar128);
                      fVar116 = fVar123;
                      fVar133 = fVar128;
                    }
                    nk_tt__handle_clipped_edge
                              (pfVar71,uVar96,pnVar74,fVar116,fVar133,fVar104,fVar127);
                  }
                  else {
                    nk_tt__handle_clipped_edge
                              (pfVar71,uVar96,pnVar74,fVar116,fVar103,fVar104,fVar127);
                    fVar116 = fVar104;
LAB_00121c7d:
                    nk_tt__handle_clipped_edge
                              (pfVar71,uVar96,pnVar74,fVar116,fVar127,fVar123,fVar128);
                    fVar104 = fVar123;
                    fVar127 = fVar128;
                  }
LAB_00121d35:
                  nk_tt__handle_clipped_edge(pfVar71,uVar96,pnVar74,fVar104,fVar127,fVar134,fVar105)
                  ;
                  fVar128 = (float)local_380;
                  fVar116 = (float)local_328._0_4_;
                  uVar96 = uVar96 + 1;
                }
              }
              else {
                if (fVar127 <= fVar103) {
                  fVar127 = fVar103;
                }
                uVar96 = (uint)fVar123;
                if (fVar105 <= fVar104) {
                  fVar104 = fVar105;
                }
                uVar55 = (uint)fVar133;
                if (uVar96 == uVar55) {
                  if (((int)uVar96 < 0) || ((int)uVar54 <= (int)uVar96)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                                  ,0x235a,
                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                 );
                  }
                  pfVar71[uVar96] =
                       (((fVar133 - (float)(int)uVar96) + (fVar123 - (float)(int)uVar96)) * -0.5 +
                       1.0) * pnVar74->direction * (fVar104 - fVar127) + pfVar71[uVar96];
                  scanline[(ulong)uVar96 + 1] =
                       (fVar104 - fVar127) * pnVar74->direction + scanline[(ulong)uVar96 + 1];
                }
                else {
                  fVar128 = pnVar74->fdy;
                  fVar131 = fVar133;
                  uVar56 = uVar96;
                  if (fVar133 < fVar123) {
                    fVar132 = fVar103 - fVar127;
                    fVar127 = (fVar103 - fVar104) + fVar105;
                    fVar128 = -fVar128;
                    fVar131 = fVar123;
                    uVar56 = uVar55;
                    uVar55 = uVar96;
                    fVar116 = fVar134;
                    fVar104 = fVar132 + fVar105;
                    fVar123 = fVar133;
                  }
                  fVar133 = (((float)(int)uVar56 + 1.0) - fVar116) * fVar128 + fVar103;
                  fVar116 = pnVar74->direction;
                  fVar134 = (fVar133 - fVar127) * fVar116;
                  pfVar71[(int)uVar56] =
                       (1.0 - ((fVar123 - (float)(int)uVar56) + 1.0) * 0.5) * fVar134 +
                       pfVar71[(int)uVar56];
                  lVar98 = (long)(int)uVar55;
                  for (lVar83 = (long)(int)(uVar56 + 1); lVar83 < lVar98; lVar83 = lVar83 + 1) {
                    pfVar71[lVar83] = fVar128 * fVar116 * 0.5 + fVar134 + pfVar71[lVar83];
                    fVar134 = fVar134 + fVar128 * fVar116;
                  }
                  pfVar71[lVar98] =
                       (fVar104 - (fVar128 * (float)(int)(uVar55 - (uVar56 + 1)) + fVar133)) *
                       (((fVar131 - (float)(int)uVar55) + 0.0) * -0.5 + 1.0) * fVar116 + fVar134 +
                       pfVar71[lVar98];
                  scanline[lVar98 + 1] = (fVar104 - fVar127) * fVar116 + scanline[lVar98 + 1];
                }
              }
            }
            else if (fVar116 < (float)local_3d0) {
              if (0.0 <= fVar116) {
                local_328 = ZEXT416((uint)fVar116);
                nk_tt__handle_clipped_edge
                          (pfVar71,(int)fVar116,pnVar74,fVar116,fVar103,fVar116,fVar105);
                iVar46 = (int)fVar116 + 1;
                auVar124 = local_328;
              }
              else {
                iVar46 = 0;
                auVar124 = ZEXT416((uint)fVar116);
              }
              nk_tt__handle_clipped_edge
                        (scanline,iVar46,pnVar74,auVar124._0_4_,fVar103,auVar124._0_4_,fVar105);
            }
          }
        }
        fVar103 = 0.0;
        size_00 = local_278 & 0xffffffff;
        nVar67 = local_2b0;
        pfVar75 = pfVar71;
        while (bVar101 = nVar67 != 0, nVar67 = nVar67 - 1, bVar101) {
          fVar103 = fVar103 + pfVar75[local_2a8];
          fVar105 = *pfVar75 + fVar103;
          auVar125._0_4_ = -fVar105;
          auVar125._4_4_ = 0x80000000;
          auVar125._8_4_ = 0x80000000;
          auVar125._12_4_ = 0x80000000;
          if (auVar125._0_4_ <= fVar105) {
            auVar125._0_4_ = fVar105;
          }
          iVar46 = (int)(auVar125._0_4_ * 255.0 + 0.5);
          uVar87 = (undefined1)iVar46;
          if (0xfe < iVar46) {
            uVar87 = 0xff;
          }
          *(undefined1 *)(local_290 + (int)size_00) = uVar87;
          size_00 = (nk_size)((int)size_00 + 1);
          pfVar75 = pfVar75 + 1;
        }
        plVar68 = (long *)&x1;
        while (plVar68 = (long *)*plVar68, plVar68 != (long *)0x0) {
          *(float *)(plVar68 + 1) = *(float *)((long)plVar68 + 0xc) + *(float *)(plVar68 + 1);
        }
        uVar80 = (ulong)((int)local_3e0 + 1);
        uVar82 = (ulong)(uint)((int)local_278 + iVar84);
        iVar46 = local_36c + 1;
      }
      while (puVar66 != (undefined8 *)0x0) {
        puVar14 = (undefined8 *)*puVar66;
        (*(code *)local_348)(_y0,puVar66);
        puVar66 = puVar14;
      }
      if (pfVar71 != (float *)&x0) {
        (*(code *)alloc[2])(*alloc,pfVar71);
      }
      (*(code *)alloc[2])(*alloc,local_300);
    }
    (*(code *)alloc[2])(*alloc,pvVar78);
    (*(code *)alloc[2])(*alloc,local_398);
  }
LAB_00120fff:
  (*(code *)alloc[2])(*alloc,(void *)CONCAT44(local_3b8._4_4_,(int)local_3b8));
  uVar85 = alloc[6].id;
  uVar10 = *(undefined4 *)(local_3d8 + 8);
  uVar96 = *(uint *)(local_3d8 + 4);
  uVar82 = extraout_RDX_03;
  if (1 < uVar85) {
    iVar84 = alloc[5].id;
    lVar83 = (long)alloc[7].ptr +
             (ulong)(ushort)((uint)uVar10 >> 0x10) * (long)iVar84 + (ulong)(ushort)uVar10;
    lVar98 = (long)(int)((uVar96 & 0xffff) - uVar85);
    for (uVar54 = 0; uVar54 != uVar96 >> 0x10; uVar54 = uVar54 + 1) {
      nk_memset(&x0,uVar85,uVar82);
      uVar82 = extraout_RDX_04;
      switch(uVar85) {
      case 2:
        uVar80 = 0;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *(byte *)(lVar83 + uVar88);
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          uVar82 = (ulong)bVar7;
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 2 & 7)) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)bVar7);
          uVar80 = (ulong)uVar55;
          *(char *)(lVar83 + uVar88) = (char)(uVar55 >> 1);
        }
        break;
      case 3:
        uVar80 = 0;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *(byte *)(lVar83 + uVar88);
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 3 & 7)) = bVar102;
          uVar80 = (ulong)((int)uVar80 + ((uint)bVar102 - (uint)bVar7));
          uVar82 = uVar80 % 3;
          *(char *)(lVar83 + uVar88) = (char)(uVar80 / 3);
        }
        break;
      case 4:
        uVar80 = 0;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *(byte *)(lVar83 + uVar88);
          uVar81 = (ulong)((uint)uVar88 & 7);
          uVar82 = uVar81 ^ 4;
          *(byte *)((long)&x0 + uVar82) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)*(byte *)((long)&x0 + uVar81));
          uVar80 = (ulong)uVar55;
          *(char *)(lVar83 + uVar88) = (char)(uVar55 >> 2);
        }
        break;
      case 5:
        uVar80 = 0;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *(byte *)(lVar83 + uVar88);
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 5 & 7)) = bVar102;
          uVar80 = (ulong)((int)uVar80 + ((uint)bVar102 - (uint)bVar7));
          uVar82 = uVar80 % 5;
          *(char *)(lVar83 + uVar88) = (char)(uVar80 / 5);
        }
        break;
      default:
        uVar80 = 0;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *(byte *)(lVar83 + uVar88);
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar85 + (uint)uVar88 & 7)) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)bVar7);
          uVar80 = (ulong)uVar55;
          uVar82 = uVar80 % (ulong)uVar85;
          *(char *)(lVar83 + uVar88) = (char)(uVar55 / uVar85);
        }
      }
      for (uVar88 = uVar88 & 0xffffffff; uVar88 < (uVar96 & 0xffff); uVar88 = uVar88 + 1) {
        if (*(char *)(lVar83 + uVar88) != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x25c3,"void nk_tt__h_prefilter(unsigned char *, int, int, int, int)");
        }
        uVar55 = (int)uVar80 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
        uVar80 = (ulong)uVar55;
        uVar82 = uVar80 % (ulong)uVar85;
        *(char *)(lVar83 + uVar88) = (char)(uVar55 / uVar85);
      }
      lVar83 = lVar83 + iVar84;
    }
    uVar10 = *(undefined4 *)(local_3d8 + 8);
    uVar96 = *(uint *)(local_3d8 + 4);
  }
  uVar85 = *(uint *)((long)alloc + 0x34);
  if (1 < uVar85) {
    lVar83 = (long)alloc[5].id;
    pbVar99 = (byte *)((long)alloc[7].ptr +
                      (ulong)(ushort)((uint)uVar10 >> 0x10) * lVar83 + (ulong)(ushort)uVar10);
    uVar69 = (ushort)(uVar96 >> 0x10);
    lVar98 = (long)(int)(uVar69 - uVar85);
    for (uVar54 = 0; uVar54 != (uVar96 & 0xffff); uVar54 = uVar54 + 1) {
      nk_memset(&x0,uVar85,uVar82);
      uVar82 = extraout_RDX_05;
      switch(uVar85) {
      case 2:
        uVar80 = 0;
        pbVar91 = pbVar99;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *pbVar91;
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 2 & 7)) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)bVar7);
          uVar80 = (ulong)uVar55;
          uVar55 = uVar55 >> 1;
          uVar82 = (ulong)uVar55;
          *pbVar91 = (byte)uVar55;
          pbVar91 = pbVar91 + lVar83;
        }
        break;
      case 3:
        uVar80 = 0;
        pbVar91 = pbVar99;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *pbVar91;
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 3 & 7)) = bVar102;
          uVar80 = (ulong)((int)uVar80 + ((uint)bVar102 - (uint)bVar7));
          uVar82 = uVar80 % 3;
          *pbVar91 = (byte)(uVar80 / 3);
          pbVar91 = pbVar91 + lVar83;
        }
        break;
      case 4:
        uVar80 = 0;
        pbVar91 = pbVar99;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *pbVar91;
          uVar82 = (ulong)((uint)uVar88 & 7);
          *(byte *)((long)&x0 + (uVar82 ^ 4)) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)*(byte *)((long)&x0 + uVar82));
          uVar80 = (ulong)uVar55;
          uVar55 = uVar55 >> 2;
          uVar82 = (ulong)uVar55;
          *pbVar91 = (byte)uVar55;
          pbVar91 = pbVar91 + lVar83;
        }
        break;
      case 5:
        uVar80 = 0;
        pbVar91 = pbVar99;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *pbVar91;
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 5 & 7)) = bVar102;
          uVar80 = (ulong)((int)uVar80 + ((uint)bVar102 - (uint)bVar7));
          uVar82 = uVar80 % 5;
          *pbVar91 = (byte)(uVar80 / 5);
          pbVar91 = pbVar91 + lVar83;
        }
        break;
      default:
        uVar80 = 0;
        pbVar91 = pbVar99;
        for (uVar88 = 0; (long)uVar88 <= lVar98; uVar88 = uVar88 + 1) {
          bVar102 = *pbVar91;
          bVar7 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + uVar85 & 7)) = bVar102;
          uVar55 = (int)uVar80 + ((uint)bVar102 - (uint)bVar7);
          uVar80 = (ulong)uVar55;
          uVar82 = uVar80 % (ulong)uVar85;
          *pbVar91 = (byte)(uVar55 / uVar85);
          pbVar91 = pbVar91 + lVar83;
        }
      }
      pbVar91 = pbVar99 + uVar88 * lVar83;
      for (uVar88 = uVar88 & 0xffffffff; uVar88 < uVar69; uVar88 = uVar88 + 1) {
        if (*pbVar91 != 0) {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x2603,"void nk_tt__v_prefilter(unsigned char *, int, int, int, int)");
        }
        uVar55 = (int)uVar80 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
        uVar80 = (ulong)uVar55;
        uVar82 = uVar80 % (ulong)uVar85;
        *pbVar91 = (byte)(uVar55 / uVar85);
        pbVar91 = pbVar91 + lVar83;
      }
      pbVar99 = pbVar99 + 1;
    }
    uVar10 = *(undefined4 *)(local_3d8 + 8);
    uVar96 = *(uint *)(local_3d8 + 4);
  }
  *local_288 = uVar10;
  uVar69 = (ushort)(uVar96 >> 0x10);
  local_288[1] = CONCAT22((short)((uint)uVar10 >> 0x10) + uVar69,(short)uVar10 + (short)uVar96);
  local_288[4] = (float)(int)(short)((short)(local_370 << 8) + (short)local_374) * local_2e8;
  auVar124._0_12_ = ZEXT812(0);
  auVar124._12_4_ = 0;
  *(ulong *)(local_288 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  *(ulong *)(local_288 + 5) =
       CONCAT44(((float)uVar69 + (float)y0_1) * local_258._4_4_ + local_248._4_4_,
                ((float)(uVar96 & 0xffff) + (float)x0_1) * local_258._0_4_ + local_248._0_4_);
  lVar83 = local_280;
  lVar79 = local_2f0;
  pnVar70 = local_3a8;
  lVar98 = local_2f8;
  auVar129 = local_248;
LAB_00121501:
  lVar83 = lVar83 + 1;
  lVar63 = lVar63 + 1;
  goto LAB_00120b4e;
}

Assistant:

NK_API const void*
nk_font_atlas_bake(struct nk_font_atlas *atlas, int *width, int *height,
    enum nk_font_atlas_format fmt)
{
    int i = 0;
    void *tmp = 0;
    nk_size tmp_size, img_size;
    struct nk_font *font_iter;
    struct nk_font_baker *baker;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(width);
    NK_ASSERT(height);
    if (!atlas || !width || !height ||
        !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

#ifdef NK_INCLUDE_DEFAULT_FONT
    /* no font added so just use default font */
    if (!atlas->font_num)
        atlas->default_font = nk_font_atlas_add_default(atlas, 13.0f, 0);
#endif
    NK_ASSERT(atlas->font_num);
    if (!atlas->font_num) return 0;

    /* allocate temporary baker memory required for the baking process */
    nk_font_baker_memory(&tmp_size, &atlas->glyph_count, atlas->config, atlas->font_num);
    tmp = atlas->temporary.alloc(atlas->temporary.userdata,0, tmp_size);
    NK_ASSERT(tmp);
    if (!tmp) goto failed;

    /* allocate glyph memory for all fonts */
    baker = nk_font_baker(tmp, atlas->glyph_count, atlas->font_num, &atlas->temporary);
    atlas->glyphs = (struct nk_font_glyph*)atlas->permanent.alloc(
        atlas->permanent.userdata,0, sizeof(struct nk_font_glyph)*(nk_size)atlas->glyph_count);
    NK_ASSERT(atlas->glyphs);
    if (!atlas->glyphs)
        goto failed;

    /* pack all glyphs into a tight fit space */
    atlas->custom.w = (NK_CURSOR_DATA_W*2)+1;
    atlas->custom.h = NK_CURSOR_DATA_H + 1;
    if (!nk_font_bake_pack(baker, &img_size, width, height, &atlas->custom,
        atlas->config, atlas->font_num, &atlas->temporary))
        goto failed;

    /* allocate memory for the baked image font atlas */
    atlas->pixel = atlas->temporary.alloc(atlas->temporary.userdata,0, img_size);
    NK_ASSERT(atlas->pixel);
    if (!atlas->pixel)
        goto failed;

    /* bake glyphs and custom white pixel into image */
    nk_font_bake(baker, atlas->pixel, *width, *height,
        atlas->glyphs, atlas->glyph_count, atlas->config, atlas->font_num);
    nk_font_bake_custom_data(atlas->pixel, *width, *height, atlas->custom,
            nk_custom_cursor_data, NK_CURSOR_DATA_W, NK_CURSOR_DATA_H, '.', 'X');

    if (fmt == NK_FONT_ATLAS_RGBA32) {
        /* convert alpha8 image into rgba32 image */
        void *img_rgba = atlas->temporary.alloc(atlas->temporary.userdata,0,
                            (nk_size)(*width * *height * 4));
        NK_ASSERT(img_rgba);
        if (!img_rgba) goto failed;
        nk_font_bake_convert(img_rgba, *width, *height, atlas->pixel);
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = img_rgba;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;

    /* initialize each font */
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        struct nk_font *font = font_iter;
        struct nk_font_config *config = font->config;
        nk_font_init(font, config->size, config->fallback_glyph, atlas->glyphs,
            config->font, nk_handle_ptr(0));
    }

    /* initialize each cursor */
    {NK_STORAGE const struct nk_vec2 nk_cursor_data[NK_CURSOR_COUNT][3] = {
        /* Pos ----- Size ------- Offset --*/
        {{ 0, 3},   {12,19},    { 0, 0}},
        {{13, 0},   { 7,16},    { 4, 8}},
        {{31, 0},   {23,23},    {11,11}},
        {{21, 0},   { 9, 23},   { 5,11}},
        {{55,18},   {23, 9},    {11, 5}},
        {{73, 0},   {17,17},    { 9, 9}},
        {{55, 0},   {17,17},    { 9, 9}}
    };
    for (i = 0; i < NK_CURSOR_COUNT; ++i) {
        struct nk_cursor *cursor = &atlas->cursors[i];
        cursor->img.w = (unsigned short)*width;
        cursor->img.h = (unsigned short)*height;
        cursor->img.region[0] = (unsigned short)(atlas->custom.x + nk_cursor_data[i][0].x);
        cursor->img.region[1] = (unsigned short)(atlas->custom.y + nk_cursor_data[i][0].y);
        cursor->img.region[2] = (unsigned short)nk_cursor_data[i][1].x;
        cursor->img.region[3] = (unsigned short)nk_cursor_data[i][1].y;
        cursor->size = nk_cursor_data[i][1];
        cursor->offset = nk_cursor_data[i][2];
    }}
    /* free temporary memory */
    atlas->temporary.free(atlas->temporary.userdata, tmp);
    return atlas->pixel;

failed:
    /* error so cleanup all memory */
    if (tmp) atlas->temporary.free(atlas->temporary.userdata, tmp);
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
    return 0;
}